

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectList.cpp
# Opt level: O2

bool __thiscall ObjectList::CreateBoundingBox(ObjectList *this,float t_start,float t_end,AABB *aabb)

{
  int iVar1;
  long lVar2;
  int i;
  long lVar3;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  AABB _temp_aabb;
  
  if ((0 < this->m_size) &&
     (iVar1 = (*(*this->m_list)->_vptr_Object[3])(*this->m_list,&_temp_aabb), (char)iVar1 != '\0'))
  {
    *(undefined8 *)((aabb->m_max).e + 1) = _temp_aabb.m_max.e._4_8_;
    *(undefined8 *)(aabb->m_min).e = _temp_aabb.m_min.e._0_8_;
    *(undefined8 *)((aabb->m_min).e + 2) = _temp_aabb._8_8_;
    lVar3 = 1;
    while( true ) {
      lVar2 = (long)this->m_size;
      if (lVar2 <= lVar3) {
        return lVar2 <= lVar3;
      }
      iVar1 = (*this->m_list[lVar3]->_vptr_Object[3])(t_start,t_end,this->m_list[lVar3],&_temp_aabb)
      ;
      if ((char)iVar1 == '\0') break;
      AABB::Merge(aabb,&_temp_aabb);
      *(undefined8 *)((aabb->m_max).e + 1) = local_50;
      *(undefined8 *)(aabb->m_min).e = local_60;
      *(undefined8 *)((aabb->m_min).e + 2) = uStack_58;
      lVar3 = lVar3 + 1;
    }
    return lVar2 <= lVar3;
  }
  return false;
}

Assistant:

bool 
ObjectList::CreateBoundingBox(float t_start, float t_end, AABB& aabb) const
{
    if(m_size < 1) {
        return false;
    }

    AABB _temp_aabb;
    if(m_list[0]->CreateBoundingBox(t_start, t_end, _temp_aabb)) {
        aabb = _temp_aabb;
    }
    else {
        return false;
    }

    for (int i = 1; i < m_size; i++) {
        if(!m_list[i]->CreateBoundingBox(t_start, t_end, _temp_aabb)) {
            return false;
        }
        aabb = AABB::Merge(aabb, _temp_aabb);
    }

    return true;
}